

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

TEXTURE_FORMAT __thiscall
Diligent::VkFormatToTexFormatMapper::operator[](VkFormatToTexFormatMapper *this,VkFormat VkFmt)

{
  __node_base_ptr p_Var1;
  TEXTURE_FORMAT TVar2;
  VkFormat local_c;
  
  if ((int)VkFmt < 0xb9) {
    TVar2 = this->m_VkFmtToTexFmtMap[VkFmt];
  }
  else {
    TVar2 = TEX_FORMAT_UNKNOWN;
    local_c = VkFmt;
    p_Var1 = std::
             _Hashtable<VkFormat,_std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>,_std::__detail::_Select1st,_std::equal_to<VkFormat>,_std::hash<VkFormat>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_VkFmtToTexFmtMapExt)._M_h,
                        (ulong)VkFmt % (this->m_VkFmtToTexFmtMapExt)._M_h._M_bucket_count,&local_c,
                        (ulong)VkFmt);
    if (p_Var1 != (__node_base_ptr)0x0) {
      if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
        TVar2 = TEX_FORMAT_UNKNOWN;
      }
      else {
        TVar2 = *(TEXTURE_FORMAT *)((long)&p_Var1->_M_nxt[1]._M_nxt + 4);
      }
    }
  }
  return TVar2;
}

Assistant:

TEXTURE_FORMAT operator[](VkFormat VkFmt) const
    {
        if (VkFmt < VK_FORMAT_RANGE_SIZE)
        {
            return m_VkFmtToTexFmtMap[VkFmt];
        }
        else
        {
            auto it = m_VkFmtToTexFmtMapExt.find(VkFmt);
            return it != m_VkFmtToTexFmtMapExt.end() ? it->second : TEX_FORMAT_UNKNOWN;
        }
    }